

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha-1.c
# Opt level: O0

void sha1_loop(sha1_ctxt *ctxt,uchar *input,size_t len)

{
  long lVar1;
  size_t local_48;
  size_t copysiz;
  size_t gaplen;
  size_t gapstart;
  size_t off;
  size_t len_local;
  uchar *input_local;
  sha1_ctxt *ctxt_local;
  
  for (gapstart = 0; gapstart < len; gapstart = local_48 + gapstart) {
    lVar1 = (long)(int)((uint)ctxt->count % 0x40);
    local_48 = 0x40 - lVar1;
    if (len - gapstart <= local_48) {
      local_48 = len - gapstart;
    }
    memcpy((void *)((long)&ctxt->m + lVar1),input + gapstart,local_48);
    ctxt->count = ctxt->count + (char)local_48;
    ctxt->count = ctxt->count % 0x40;
    (ctxt->c).b64[0] = local_48 * 8 + (ctxt->c).b64[0];
    if ((uint)ctxt->count % 0x40 == 0) {
      sha1_step(ctxt);
    }
  }
  return;
}

Assistant:

void
sha1_loop(struct sha1_ctxt *ctxt, const unsigned char *input, size_t len)
{
	size_t off;

	off = 0;

	while (off < len) {
		size_t gapstart = COUNT % 64, gaplen = 64 - gapstart,
		       copysiz = (gaplen < len - off) ? gaplen : len - off;

		memcpy(&ctxt->m.b8[gapstart], &input[off], copysiz);
		COUNT = (unsigned char)(COUNT + copysiz);
		COUNT %= 64;
		ctxt->c.b64[0] += copysiz * 8;
		if (COUNT % 64 == 0)
			sha1_step(ctxt);
		off += copysiz;
	}
}